

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O0

optional<wasm::HeapType> __thiscall
wasm::(anonymous_namespace)::AbstractTypeRefining::optimize(wasm::Module*,wasm::SubTypes_const&)::
AbstractTypeRefiningTypeMapper::getDeclaredSuperType(wasm::HeapType_(void *this,HeapType oldType)

{
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  *this_00;
  bool bVar1;
  size_type sVar2;
  HeapType *pHVar3;
  undefined1 uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  bool bVar6;
  optional<wasm::HeapType> oVar7;
  AbstractTypeRefiningTypeMapper *this_local;
  HeapType oldType_local;
  optional<wasm::HeapType> super;
  
  this_local = (AbstractTypeRefiningTypeMapper *)oldType.id;
  oVar7 = HeapType::getDeclaredSuperType((HeapType *)&this_local);
  oldType_local.id =
       oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  uVar4 = oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged;
  while( true ) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&oldType_local);
    bVar6 = false;
    uVar5 = extraout_RDX;
    if (bVar1) {
      this_00 = *(unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                  **)((long)this + 0x68);
      pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&oldType_local);
      sVar2 = std::
              unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
              ::count(this_00,pHVar3);
      bVar6 = sVar2 != 0;
      uVar5 = extraout_RDX_00;
    }
    if (!bVar6) break;
    pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&oldType_local);
    oVar7 = HeapType::getDeclaredSuperType(pHVar3);
    oldType_local.id =
         oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_payload;
    uVar4 = oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged;
  }
  oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_7_ = (undefined7)((ulong)uVar5 >> 8);
  oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)uVar4;
  oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
       (HeapType)(HeapType)oldType_local.id;
  return (optional<wasm::HeapType>)
         oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> getDeclaredSuperType(HeapType oldType) override {
        auto super = oldType.getDeclaredSuperType();

        // Go up the chain of supertypes, skipping things we are mapping away,
        // as those things will not appear in the output. This skips B in the
        // example above.
        while (super && mapping.count(*super)) {
          super = super->getDeclaredSuperType();
        }
        return super;
      }